

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

stbtt__buf stbtt__cff_get_index(stbtt__buf *b)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uchar *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  stbtt__buf sVar11;
  
  uVar2 = b->cursor;
  uVar8 = 0;
  iVar6 = 2;
  uVar4 = (ulong)uVar2;
  do {
    iVar3 = (int)uVar4;
    if (iVar3 < b->size) {
      uVar4 = (ulong)(iVar3 + 1U);
      b->cursor = iVar3 + 1U;
      uVar10 = (uint)b->data[iVar3];
    }
    else {
      uVar10 = 0;
    }
    iVar3 = (int)uVar4;
    uVar8 = uVar8 << 8 | uVar10;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  if (uVar8 != 0) {
    if (iVar3 < b->size) {
      b->cursor = iVar3 + 1;
      bVar1 = b->data[iVar3];
      uVar10 = (uint)bVar1;
      if ((byte)(bVar1 - 1) < 4) {
        stbtt__buf_skip(b,uVar8 * bVar1);
        iVar6 = b->cursor;
        uVar8 = 0;
        do {
          if (iVar6 < b->size) {
            lVar9 = (long)iVar6;
            iVar6 = iVar6 + 1;
            b->cursor = iVar6;
            uVar7 = (uint)b->data[lVar9];
          }
          else {
            uVar7 = 0;
          }
          uVar8 = uVar8 << 8 | uVar7;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        stbtt__buf_skip(b,uVar8 - 1);
        iVar3 = b->cursor;
        goto LAB_0012bc95;
      }
    }
    __assert_fail("offsize >= 1 && offsize <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imstb_truetype.h"
                  ,0x49c,"stbtt__buf stbtt__cff_get_index(stbtt__buf *)");
  }
LAB_0012bc95:
  if ((int)(iVar3 - uVar2 | uVar2) < 0) {
    puVar5 = (uchar *)0x0;
    lVar9 = 0;
  }
  else {
    puVar5 = (uchar *)0x0;
    lVar9 = 0;
    if (iVar3 <= b->size && (int)uVar2 <= b->size) {
      puVar5 = b->data + uVar2;
      lVar9 = (ulong)(iVar3 - uVar2) << 0x20;
    }
  }
  sVar11.cursor = (int)lVar9;
  sVar11.size = (int)((ulong)lVar9 >> 0x20);
  sVar11.data = puVar5;
  return sVar11;
}

Assistant:

static stbtt__buf stbtt__cff_get_index(stbtt__buf *b)
{
   int count, start, offsize;
   start = b->cursor;
   count = stbtt__buf_get16(b);
   if (count) {
      offsize = stbtt__buf_get8(b);
      STBTT_assert(offsize >= 1 && offsize <= 4);
      stbtt__buf_skip(b, offsize * count);
      stbtt__buf_skip(b, stbtt__buf_get(b, offsize) - 1);
   }
   return stbtt__buf_range(b, start, b->cursor - start);
}